

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestSpec *spec)

{
  ostream *poVar1;
  ostringstream stream;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Test ",5);
  if (((byte)this[4] & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"atomicCounter()",0xf);
  }
  if (((byte)this[4] & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190," atomicCounterIncrement()",0x19);
  }
  if (((byte)this[4] & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190," atomicCounterDecrement()",0x19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," calls with ",0xc);
  if (this[0xc] == (_anonymous_namespace_)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," branches, ",0xb);
  }
  poVar1 = (ostream *)std::ostream::operator<<(local_190,*(int *)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," atomic counters, ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(this + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," calls and ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(this + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," threads.",9);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string specToTestDescription (const AtomicCounterTest::TestSpec& spec)
{
	std::ostringstream	stream;
	bool				firstOperation = 0;

	stream
	<< "Test ";

	if ((spec.operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "atomicCounter()";
		firstOperation = false;
	}

	if ((spec.operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterIncrement()";
		firstOperation = false;
	}

	if ((spec.operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterDecrement()";
		firstOperation = false;
	}

	stream << " calls with ";

	if (spec.useBranches)
		stream << " branches, ";

	stream << spec.atomicCounterCount << " atomic counters, " << spec.callCount << " calls and " << spec.threadCount << " threads.";

	return stream.str();
}